

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseDelphiCoverage.cxx
# Opt level: O3

bool __thiscall cmParseDelphiCoverage::HTMLParser::ParseFile(HTMLParser *this,char *file)

{
  cmCTest *pcVar1;
  pointer pcVar2;
  key_type *__k;
  bool bVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  long *plVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  mapped_type *coverageVector;
  size_type *psVar9;
  char cVar10;
  bool bVar11;
  string filename;
  string glob;
  string lineresult;
  string filelineoffset;
  string lastroutine;
  string line;
  Glob gl;
  ifstream in;
  char *local_370;
  long local_368;
  char local_360;
  undefined7 uStack_35f;
  long *local_350 [2];
  long local_340 [2];
  string local_330;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300;
  undefined7 uStack_2ff;
  char *local_2f0;
  undefined8 local_2e8;
  char local_2e0;
  undefined7 uStack_2df;
  undefined1 *local_2d0;
  undefined8 local_2c8;
  undefined1 local_2c0;
  undefined7 uStack_2bf;
  string local_2b0;
  undefined1 local_290 [48];
  bool local_260;
  undefined1 local_238 [16];
  _func_int *local_228 [2];
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,file,(allocator<char> *)local_238);
  local_310 = &local_300;
  local_308 = 0;
  local_300 = 0;
  local_2d0 = &local_2c0;
  local_2c8 = 0;
  local_2c0 = 0;
  local_370 = &local_360;
  local_368 = 0;
  local_360 = '\0';
  local_2f0 = &local_2e0;
  local_2e8 = 0;
  local_2e0 = '\0';
  lVar5 = std::__cxx11::string::find((char)&local_2b0,0x28);
  if (lVar5 != -1) {
    do {
      cVar10 = (char)&local_2b0;
      std::__cxx11::string::find(cVar10,0x29);
      std::__cxx11::string::substr((ulong)local_238,(ulong)&local_2b0);
      std::__cxx11::string::operator=((string *)&local_370,(string *)local_238);
      if ((_func_int **)local_238._0_8_ != local_228) {
        operator_delete((void *)local_238._0_8_,(ulong)(local_228[0] + 1));
      }
      lVar5 = std::__cxx11::string::find((char *)&local_370,0x905638,0);
      if (lVar5 != -1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_238,"Coverage found for file:  ",0x1a);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_238,local_370,local_368);
        std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        pcVar1 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseDelphiCoverage.cxx"
                     ,0x7c,(char *)local_290._0_8_,this->Coverage->Quiet);
        if ((GlobInternals *)local_290._0_8_ != (GlobInternals *)(local_290 + 0x10)) {
          operator_delete((void *)local_290._0_8_,(ulong)(local_290._16_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
        std::ios_base::~ios_base(local_1c8);
        cmsys::Glob::Glob((Glob *)local_290);
        local_290[8] = true;
        local_260 = false;
        local_238._0_8_ = local_228;
        pcVar2 = (this->Coverage->SourceDir)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_238,pcVar2,pcVar2 + (this->Coverage->SourceDir)._M_string_length)
        ;
        std::__cxx11::string::append(local_238);
        plVar7 = (long *)std::__cxx11::string::_M_append(local_238,(ulong)local_370);
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_330.field_2._M_allocated_capacity = *psVar9;
          local_330.field_2._8_8_ = plVar7[3];
        }
        else {
          local_330.field_2._M_allocated_capacity = *psVar9;
          local_330._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_330._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((_func_int **)local_238._0_8_ != local_228) {
          operator_delete((void *)local_238._0_8_,(ulong)(local_228[0] + 1));
        }
        cmsys::Glob::FindFiles((Glob *)local_290,&local_330,(GlobMessages *)0x0);
        pvVar8 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_290);
        __k = (pvVar8->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
        if (__k == (pvVar8->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_238,"Unable to find file matching",0x1c);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_238,local_330._M_dataplus._M_p,
                              local_330._M_string_length);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          pcVar1 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseDelphiCoverage.cxx"
                       ,0x92,(char *)local_350[0],this->Coverage->Quiet);
          if (local_350[0] != local_340) {
            operator_delete(local_350[0],local_340[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
          std::ios_base::~ios_base(local_1c8);
          bVar11 = false;
        }
        else {
          coverageVector =
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](&this->Coverage->TotalCoverage,__k);
          initializeDelphiFile
                    (this,(pvVar8->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,coverageVector);
          std::ifstream::ifstream(local_238,file,_S_in);
          bVar11 = (abStack_218[(long)*(_func_int **)(local_238._0_8_ + -0x18)] & 5) == 0;
          if (bVar11) {
            while (bVar3 = cmsys::SystemTools::GetLineFromStream
                                     ((istream *)local_238,&local_2b0,(bool *)0x0,0xffffffffffffffff
                                     ), bVar3) {
              lVar5 = std::__cxx11::string::find((char *)&local_2b0,0x905675,0);
              if (lVar5 != -1) {
                std::__cxx11::string::find((char *)&local_2b0,0x90567c,0);
                cVar10 = (char)&local_2b0;
                std::__cxx11::string::find(cVar10,0x3e);
                std::__cxx11::string::substr((ulong)local_350,(ulong)&local_2b0);
                std::__cxx11::string::operator=((string *)&local_310,(string *)local_350);
                if (local_350[0] != local_340) {
                  operator_delete(local_350[0],local_340[0] + 1);
                }
                iVar4 = std::__cxx11::string::compare((char *)&local_310);
                if (iVar4 == 0) {
                  std::__cxx11::string::find(cVar10,0x3c);
                  std::__cxx11::string::substr((ulong)local_350,(ulong)&local_2b0);
                  std::__cxx11::string::operator=((string *)&local_2f0,(string *)local_350);
                  if (local_350[0] != local_340) {
                    operator_delete(local_350[0],local_340[0] + 1);
                  }
                  iVar4 = atoi(local_2f0);
                  (coverageVector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[(long)iVar4 + -1] = 1;
                }
              }
            }
          }
          std::ifstream::~ifstream(local_238);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
        cmsys::Glob::~Glob((Glob *)local_290);
        goto LAB_00282f3c;
      }
      lVar5 = std::__cxx11::string::find(cVar10,0x28);
    } while (lVar5 != -1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_238);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"File not found  ",0x10);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseDelphiCoverage.cxx"
               ,0x73,(char *)local_290._0_8_,this->Coverage->Quiet);
  if ((GlobInternals *)local_290._0_8_ != (GlobInternals *)(local_290 + 0x10)) {
    operator_delete((void *)local_290._0_8_,(ulong)(local_290._16_8_ + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base(local_1c8);
  bVar11 = false;
LAB_00282f3c:
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,CONCAT71(uStack_2df,local_2e0) + 1);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370,CONCAT71(uStack_35f,local_360) + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,CONCAT71(uStack_2bf,local_2c0) + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,CONCAT71(uStack_2ff,local_300) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  return bVar11;
}

Assistant:

bool ParseFile(const char* file)
  {
    std::string line = file;
    std::string lineresult;
    std::string lastroutine;
    std::string filename;
    std::string filelineoffset;
    size_t afterLineNum = 0;
    size_t lastoffset = 0;
    size_t endcovpos = 0;
    size_t endnamepos = 0;
    size_t pos = 0;

    /*
     *  This first 'while' section goes through the found HTML
     *  file name and attempts to capture the source file name
     *   which is set as part of the HTML file name: the name of
     *   the file is found in parenthesis '()'
     *
     *   See test HTML file name: UTCovTest(UTCovTest.pas).html.
     *
     *   Find the text inside each pair of parenthesis and check
     *   to see if it ends in '.pas'.  If it can't be found,
     *   exit the function.
     */
    while (true) {
      lastoffset = line.find('(', pos);
      if (lastoffset == std::string::npos) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           endnamepos << "File not found  " << lastoffset
                                      << std::endl,
                           this->Coverage.Quiet);
        return false;
      }
      endnamepos = line.find(')', lastoffset);
      filename = line.substr(lastoffset + 1, (endnamepos - 1) - lastoffset);
      if (filename.find(".pas") != std::string::npos) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "Coverage found for file:  " << filename
                                                        << std::endl,
                           this->Coverage.Quiet);
        break;
      }
      pos = lastoffset + 1;
    }
    /*
     *  Glob through the source directory for the
     *  file found above
     */
    cmsys::Glob gl;
    gl.RecurseOn();
    gl.RecurseThroughSymlinksOff();
    std::string glob = this->Coverage.SourceDir + "*/" + filename;
    gl.FindFiles(glob);
    std::vector<std::string> const& files = gl.GetFiles();
    if (files.empty()) {
      /*
       *  If that doesn't find any matching files
       *  return a failure.
       */
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Unable to find file matching" << glob << std::endl,
                         this->Coverage.Quiet);
      return false;
    }
    FileLinesType& coverageVector = this->Coverage.TotalCoverage[files[0]];

    /*
     *  Initialize the file to have all code between 'begin' and
     *  'end' tags marked as executable
     */

    this->initializeDelphiFile(files[0], coverageVector);

    cmsys::ifstream in(file);
    if (!in) {
      return false;
    }

    /*
     *  Now read the HTML file, looking for the lines that have an
     *  "inline" in it. Then parse out the "class" value of that
     *  line to determine if the line is executed or not.
     *
     *  Sample HTML line:
     *
     *  <tr class="covered"><td>47</td><td><pre style="display:inline;">
     *    &nbsp;CheckEquals(1,2-1);</pre></td></tr>
     *
     */

    while (cmSystemTools::GetLineFromStream(in, line)) {
      if (line.find("inline") == std::string::npos) {
        continue;
      }

      lastoffset = line.find("class=");
      endcovpos = line.find('>', lastoffset);
      lineresult = line.substr(lastoffset + 7, (endcovpos - 8) - lastoffset);

      if (lineresult == "covered") {
        afterLineNum = line.find('<', endcovpos + 5);
        filelineoffset =
          line.substr(endcovpos + 5, afterLineNum - (endcovpos + 5));
        coverageVector[atoi(filelineoffset.c_str()) - 1] = 1;
      }
    }
    return true;
  }